

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmemarena.h
# Opt level: O0

void * __thiscall cookmem::FixedArena::getSegment(FixedArena *this,size_t *size)

{
  size_t *size_local;
  FixedArena *this_local;
  
  if (((this->m_used & 1U) == 0) && (*size <= this->m_size)) {
    this->m_used = true;
    *size = this->m_size;
    this_local = (FixedArena *)this->m_page;
  }
  else {
    this_local = (FixedArena *)0x0;
  }
  return this_local;
}

Assistant:

void*
    getSegment (std::size_t& size)
    {
        if (m_used || size > m_size)
        {
            return NULL;
        }
        m_used = true;
        size = m_size;
        return m_page;
    }